

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnGlobalGetExpr
          (BinaryReaderInterp *this,Index global_index)

{
  Index index;
  bool bVar1;
  reference pvVar2;
  Type local_b0;
  Type type;
  Var local_88;
  Location local_40;
  Enum local_20;
  Index local_1c;
  BinaryReaderInterp *pBStack_18;
  Index global_index_local;
  BinaryReaderInterp *this_local;
  
  local_1c = global_index;
  pBStack_18 = this;
  GetLocation(&local_40,this);
  index = local_1c;
  GetLocation((Location *)&type,this);
  Var::Var(&local_88,index,(Location *)&type);
  local_20 = (Enum)SharedValidator::OnGlobalGet(&this->validator_,&local_40,&local_88);
  bVar1 = Failed((Result)local_20);
  Var::~Var(&local_88);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    pvVar2 = std::vector<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>::at
                       (&this->global_types_,(ulong)local_1c);
    local_b0 = *(Type *)&(pvVar2->super_ExternType).field_0xc;
    bVar1 = Type::IsRef(&local_b0);
    if (bVar1) {
      Istream::Emit(this->istream_,InterpGlobalGetRef,local_1c);
    }
    else {
      Istream::Emit(this->istream_,GlobalGet,local_1c);
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnGlobalGetExpr(Index global_index) {
  CHECK_RESULT(
      validator_.OnGlobalGet(GetLocation(), Var(global_index, GetLocation())));

  Type type = global_types_.at(global_index).type;
  if (type.IsRef()) {
    istream_.Emit(Opcode::InterpGlobalGetRef, global_index);
  } else {
    istream_.Emit(Opcode::GlobalGet, global_index);
  }
  return Result::Ok;
}